

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void searchCluster(Mat *binary,mPoint *point,
                  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *cluster)

{
  bool bVar1;
  reference pmVar2;
  uchar *puVar3;
  pair<std::_Rb_tree_const_iterator<mPoint>,_bool> pVar4;
  mPoint local_180;
  Mat local_178 [96];
  Point_<int> local_118;
  _Self local_110;
  _Base_ptr local_108;
  _Rb_tree_const_iterator<mPoint> local_100;
  _Self local_f8;
  Point_<int> local_f0;
  mPoint neighbor;
  iterator __end1;
  iterator __begin1;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *__range1;
  mPoint local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  mPoint local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  mPoint local_90;
  _Base_ptr local_88;
  undefined1 local_80;
  mPoint local_68;
  undefined1 local_60 [8];
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> neighbors;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *cluster_local;
  mPoint *point_local;
  Mat *binary_local;
  
  pVar4 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::insert(cluster,point);
  neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar4.first._M_node;
  std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::set
            ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60);
  if (0 < (point->super_Point).x) {
    mPoint::mPoint(&local_68,(point->super_Point).x + -1,(point->super_Point).y);
    pVar4 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::insert
                      ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60,&local_68
                      );
    local_88 = (_Base_ptr)pVar4.first._M_node;
    local_80 = pVar4.second;
  }
  if (0 < (point->super_Point).y) {
    mPoint::mPoint(&local_90,(point->super_Point).x,(point->super_Point).y + -1);
    pVar4 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::insert
                      ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60,&local_90
                      );
    local_a0 = (_Base_ptr)pVar4.first._M_node;
    local_98 = pVar4.second;
  }
  if ((point->super_Point).x < *(int *)(binary + 0xc) + -1) {
    mPoint::mPoint(&local_a8,(point->super_Point).x + 1,(point->super_Point).y);
    pVar4 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::insert
                      ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60,&local_a8
                      );
    local_b8 = (_Base_ptr)pVar4.first._M_node;
    local_b0 = pVar4.second;
  }
  if ((point->super_Point).y < *(int *)(binary + 8) + -1) {
    mPoint::mPoint(&local_c0,(point->super_Point).x,(point->super_Point).y + 1);
    std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::insert
              ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60,&local_c0);
  }
  __end1 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::begin
                     ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60);
  neighbor.super_Point =
       (Point)std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::end
                        ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&neighbor), bVar1) {
    pmVar2 = std::_Rb_tree_const_iterator<mPoint>::operator*(&__end1);
    mPoint::mPoint((mPoint *)&local_f0,pmVar2);
    local_100._M_node =
         (_Base_ptr)std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::begin(cluster);
    local_108 = (_Base_ptr)
                std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::end(cluster);
    local_f8._M_node =
         (_Base_ptr)
         std::find<std::_Rb_tree_const_iterator<mPoint>,mPoint>
                   (local_100,(_Rb_tree_const_iterator<mPoint>)local_108,(mPoint *)&local_f0);
    local_110._M_node =
         (_Base_ptr)std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::end(cluster);
    bVar1 = std::operator==(&local_f8,&local_110);
    if (bVar1) {
      cv::Point_<int>::Point_(&local_118,&local_f0);
      puVar3 = cv::Mat::at<unsigned_char>(binary,&local_118);
      if (*puVar3 == 0xff) {
        cv::Mat::Mat(local_178,binary);
        mPoint::mPoint(&local_180,(mPoint *)&local_f0);
        searchCluster(local_178,&local_180,cluster);
        cv::Mat::~Mat(local_178);
      }
    }
    std::_Rb_tree_const_iterator<mPoint>::operator++(&__end1);
  }
  std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::~set
            ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_60);
  return;
}

Assistant:

void searchCluster(cv::Mat binary, mPoint point, std::set<mPoint>& cluster) {
	cluster.insert(point);

	std::set<mPoint> neighbors;
	if (point.x >= 1)
		neighbors.insert(mPoint(point.x - 1, point.y));
	if (point.y >= 1)
		neighbors.insert(mPoint(point.x, point.y - 1));
	if (point.x < binary.cols - 1)
		neighbors.insert(mPoint(point.x + 1, point.y));
	if (point.y < binary.rows - 1)
		neighbors.insert(mPoint(point.x, point.y + 1));

	for (auto neighbor : neighbors) {
		if (std::find(cluster.begin(), cluster.end(), neighbor) == cluster.end()) {
			if (binary.at<uchar>(neighbor) == UCHAR_MAX) {
				searchCluster(binary, neighbor, cluster);
			}
		}
	}
}